

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentStack_test.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  int local_1c;
  
  local_1c = 1;
  ConcurrentStack<int>::push(&stack,&local_1c);
  iVar1 = ConcurrentStack<int>::top(&stack);
  if (iVar1 != 1) {
    __assert_fail("stack.top() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/NJdevPro[P]Behaviour-Tree/src/ConcurrentStack_test.cpp"
                  ,0x10,"int main()");
  }
  local_1c = 2;
  ConcurrentStack<int>::push(&stack,&local_1c);
  local_1c = 3;
  ConcurrentStack<int>::push(&stack,&local_1c);
  local_1c = 4;
  ConcurrentStack<int>::push(&stack,&local_1c);
  local_1c = 5;
  ConcurrentStack<int>::push(&stack,&local_1c);
  iVar1 = ConcurrentStack<int>::top(&stack);
  if (iVar1 != 5) {
    __assert_fail("stack.top() == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/NJdevPro[P]Behaviour-Tree/src/ConcurrentStack_test.cpp"
                  ,0x15,"int main()");
  }
  iVar1 = ConcurrentStack<int>::pop(&stack);
  if (iVar1 != 5) {
    __assert_fail("stack.pop() == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/NJdevPro[P]Behaviour-Tree/src/ConcurrentStack_test.cpp"
                  ,0x16,"int main()");
  }
  iVar1 = ConcurrentStack<int>::pop(&stack);
  if (iVar1 == 4) {
    iVar1 = ConcurrentStack<int>::pop(&stack);
    if (iVar1 != 3) {
      __assert_fail("stack.pop() == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/NJdevPro[P]Behaviour-Tree/src/ConcurrentStack_test.cpp"
                    ,0x18,"int main()");
    }
    iVar1 = ConcurrentStack<int>::pop(&stack);
    if (iVar1 == 2) {
      iVar1 = ConcurrentStack<int>::pop(&stack);
      if (iVar1 == 1) {
        return 0;
      }
      __assert_fail("stack.pop() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/NJdevPro[P]Behaviour-Tree/src/ConcurrentStack_test.cpp"
                    ,0x1a,"int main()");
    }
    __assert_fail("stack.pop() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/NJdevPro[P]Behaviour-Tree/src/ConcurrentStack_test.cpp"
                  ,0x19,"int main()");
  }
  __assert_fail("stack.pop() == 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/NJdevPro[P]Behaviour-Tree/src/ConcurrentStack_test.cpp"
                ,0x17,"int main()");
}

Assistant:

int main()
{
    //assert(stack.top() == 0);
    //assert(stack.pop() == 0);
    stack.push(1);
    assert(stack.top() == 1);
    stack.push(2);
    stack.push(3);
    stack.push(4);
    stack.push(5);
    assert(stack.top() == 5);
    assert(stack.pop() == 5);
    assert(stack.pop() == 4);
    assert(stack.pop() == 3);
    assert(stack.pop() == 2);
    assert(stack.pop() == 1);
}